

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

bool __thiscall Assimp::AMFImporter::XML_ReadNode_GetAttrVal_AsBool(AMFImporter *this,int pAttrIdx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  bool bVar3;
  undefined4 in_register_00000034;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                    (this->mReader,CONCAT44(in_register_00000034,pAttrIdx));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_58);
  bVar1 = std::operator==(&val,"false");
  if (!bVar1) {
    bVar1 = std::operator==(&val,"0");
    if (!bVar1) {
      bVar1 = std::operator==(&val,"true");
      bVar3 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&val,"1");
        if (!bVar1) {
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::operator+(&local_38,
                         "Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \""
                         ,&val);
          std::operator+(&local_58,&local_38,"\"");
          DeadlyImportError::DeadlyImportError(this_00,&local_58);
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      goto LAB_003b6bee;
    }
  }
  bVar3 = false;
LAB_003b6bee:
  std::__cxx11::string::~string((string *)&val);
  return bVar3;
}

Assistant:

bool AMFImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    std::string val(mReader->getAttributeValue(pAttrIdx));

	if((val == "false") || (val == "0"))
		return false;
	else if((val == "true") || (val == "1"))
		return true;
	else
		throw DeadlyImportError("Bool attribute value can contain \"false\"/\"0\" or \"true\"/\"1\" not the \"" + val + "\"");
}